

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolb.c
# Opt level: O0

int fffi1i1(uchar *input,long ntodo,double scale,double zero,int nullcheck,uchar tnull,uchar nullval
           ,char *nullarray,int *anynull,uchar *output,int *status)

{
  char in_CL;
  int in_EDX;
  size_t in_RSI;
  void *in_RDI;
  undefined1 in_R8B;
  long in_R9;
  double in_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  double dvalue;
  long ii;
  undefined8 local_38;
  
  if (in_EDX == 0) {
    if (((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) || ((in_XMM1_Qa != 0.0 || (NAN(in_XMM1_Qa))))) {
      for (local_38 = 0; local_38 < (long)in_RSI; local_38 = local_38 + 1) {
        dVar1 = (double)*(byte *)((long)in_RDI + local_38) * in_XMM0_Qa + in_XMM1_Qa;
        if (-0.49 <= dVar1) {
          if (dVar1 <= 255.49) {
            *(char *)(ii + local_38) = (char)(int)dVar1;
          }
          else {
            nullarray[0] = -0xb;
            nullarray[1] = -1;
            nullarray[2] = -1;
            nullarray[3] = -1;
            *(undefined1 *)(ii + local_38) = 0xff;
          }
        }
        else {
          nullarray[0] = -0xb;
          nullarray[1] = -1;
          nullarray[2] = -1;
          nullarray[3] = -1;
          *(undefined1 *)(ii + local_38) = 0;
        }
      }
    }
    else {
      memmove((void *)ii,in_RDI,in_RSI);
    }
  }
  else if ((((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) || (in_XMM1_Qa != 0.0)) || (NAN(in_XMM1_Qa)))
  {
    for (local_38 = 0; local_38 < (long)in_RSI; local_38 = local_38 + 1) {
      if (*(char *)((long)in_RDI + local_38) == in_CL) {
        *(undefined4 *)dvalue = 1;
        if (in_EDX == 1) {
          *(undefined1 *)(ii + local_38) = in_R8B;
        }
        else {
          *(undefined1 *)(in_R9 + local_38) = 1;
        }
      }
      else {
        dVar1 = (double)*(byte *)((long)in_RDI + local_38) * in_XMM0_Qa + in_XMM1_Qa;
        if (-0.49 <= dVar1) {
          if (dVar1 <= 255.49) {
            *(char *)(ii + local_38) = (char)(int)dVar1;
          }
          else {
            nullarray[0] = -0xb;
            nullarray[1] = -1;
            nullarray[2] = -1;
            nullarray[3] = -1;
            *(undefined1 *)(ii + local_38) = 0xff;
          }
        }
        else {
          nullarray[0] = -0xb;
          nullarray[1] = -1;
          nullarray[2] = -1;
          nullarray[3] = -1;
          *(undefined1 *)(ii + local_38) = 0;
        }
      }
    }
  }
  else {
    for (local_38 = 0; local_38 < (long)in_RSI; local_38 = local_38 + 1) {
      if (*(char *)((long)in_RDI + local_38) == in_CL) {
        *(undefined4 *)dvalue = 1;
        if (in_EDX == 1) {
          *(undefined1 *)(ii + local_38) = in_R8B;
        }
        else {
          *(undefined1 *)(in_R9 + local_38) = 1;
        }
      }
      else {
        *(undefined1 *)(ii + local_38) = *(undefined1 *)((long)in_RDI + local_38);
      }
    }
  }
  return *(int *)nullarray;
}

Assistant:

int fffi1i1(unsigned char *input, /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            unsigned char tnull,  /* I - value of FITS TNULLn keyword if any */
            unsigned char nullval,/* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            unsigned char *output,/* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {              /* this routine is normally not called in this case */
           memmove(output, input, ntodo );
        }
        else             /* must scale the data */
        {                
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DUCHAR_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (dvalue > DUCHAR_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = UCHAR_MAX;
                }
                else
                    output[ii] = (unsigned char) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                    output[ii] = input[ii];
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DUCHAR_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (dvalue > DUCHAR_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = UCHAR_MAX;
                    }
                    else
                        output[ii] = (unsigned char) dvalue;
                }
            }
        }
    }
    return(*status);
}